

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O3

spvc_bool spvc_compiler_get_binary_offset_for_decoration
                    (spvc_compiler compiler,spvc_variable_id id,SpvDecoration decoration,
                    uint *word_offset)

{
  bool bVar1;
  uint32_t off;
  uint32_t local_c;
  
  local_c = 0;
  bVar1 = spirv_cross::Compiler::get_binary_offset_for_decoration
                    ((compiler->compiler)._M_t.
                     super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                     .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl,
                     (VariableID)id,decoration,&local_c);
  if (bVar1) {
    *word_offset = local_c;
  }
  return bVar1;
}

Assistant:

spvc_bool spvc_compiler_get_binary_offset_for_decoration(spvc_compiler compiler, spvc_variable_id id,
                                                         SpvDecoration decoration,
                                                         unsigned *word_offset)
{
	uint32_t off = 0;
	bool ret = compiler->compiler->get_binary_offset_for_decoration(id, static_cast<spv::Decoration>(decoration), off);
	if (ret)
	{
		*word_offset = off;
		return SPVC_TRUE;
	}
	else
		return SPVC_FALSE;
}